

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Plugin::Fl_Plugin(Fl_Plugin *this,char *klass,char *name)

{
  ID pvVar1;
  Fl_Plugin_Manager pm;
  Fl_Plugin_Manager local_30;
  
  this->_vptr_Fl_Plugin = (_func_int **)&PTR__Fl_Plugin_00278cd8;
  this->id = (ID)0x0;
  Fl_Plugin_Manager::Fl_Plugin_Manager(&local_30,klass);
  pvVar1 = Fl_Plugin_Manager::addPlugin(&local_30,name,this);
  this->id = pvVar1;
  Fl_Plugin_Manager::~Fl_Plugin_Manager(&local_30);
  return;
}

Assistant:

Fl_Plugin::Fl_Plugin(const char *klass, const char *name)
: id(0) {
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: creating a plugin, class \"%s\", name \"%s\"\n",
         klass, name);
#endif
  Fl_Plugin_Manager pm(klass);
  id = pm.addPlugin(name, this);
}